

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::BaseTag(BaseTag *this)

{
  ulong *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong uVar4;
  istringstream iss;
  ulong *local_320;
  long local_318;
  ulong local_310;
  undefined4 uStack_308;
  undefined4 uStack_304;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  long *local_220;
  undefined8 local_218;
  long local_210;
  undefined8 uStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0 [2];
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0 [2];
  Floor *local_1c0;
  BeliefMDP *local_1b8;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  *(code **)this = std::ifstream::~ifstream;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseTag_0011f438;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_0011f568;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_0011f670;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_0011f6a8;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_0011f6d0;
  local_1b8 = &this->super_BeliefMDP;
  despot::Floor::Floor(&this->floor_);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  current_ = this;
  local_200 = local_1f0;
  local_1c0 = &this->floor_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"mapSize = 5 10\n","");
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"#####...##\n","");
  uVar4 = 0xf;
  if (local_200 != local_1f0) {
    uVar4 = local_1f0[0];
  }
  if (uVar4 < (ulong)(local_238 + local_1f8)) {
    uVar4 = 0xf;
    if (local_240 != local_230) {
      uVar4 = local_230[0];
    }
    if (uVar4 < (ulong)(local_238 + local_1f8)) goto LAB_0010e9b0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,(ulong)local_200);
  }
  else {
LAB_0010e9b0:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_240);
  }
  local_320 = &local_310;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_310 = *puVar1;
    uStack_308 = *(undefined4 *)(puVar3 + 3);
    uStack_304 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_310 = *puVar1;
    local_320 = (ulong *)*puVar3;
  }
  local_318 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"#####...##\n","");
  uVar4 = 0xf;
  if (local_320 != &local_310) {
    uVar4 = local_310;
  }
  if (uVar4 < (ulong)(local_258 + local_318)) {
    uVar4 = 0xf;
    if (local_260 != local_250) {
      uVar4 = local_250[0];
    }
    if (uVar4 < (ulong)(local_258 + local_318)) goto LAB_0010ea90;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_0010ea90:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_260);
  }
  local_300 = &local_2f0;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_2f0 = *puVar1;
    uStack_2e8 = *(undefined4 *)(puVar3 + 3);
    uStack_2e4 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_2f0 = *puVar1;
    local_300 = (ulong *)*puVar3;
  }
  local_2f8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"#####...##\n","");
  uVar4 = 0xf;
  if (local_300 != &local_2f0) {
    uVar4 = local_2f0;
  }
  if (uVar4 < (ulong)(local_278 + local_2f8)) {
    uVar4 = 0xf;
    if (local_280 != local_270) {
      uVar4 = local_270[0];
    }
    if (uVar4 < (ulong)(local_278 + local_2f8)) goto LAB_0010eb6d;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0010eb6d:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_280);
  }
  local_2e0 = &local_2d0;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_2d0 = *puVar1;
    uStack_2c8 = *(undefined4 *)(puVar3 + 3);
    uStack_2c4 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_2d0 = *puVar1;
    local_2e0 = (ulong *)*puVar3;
  }
  local_2d8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"...........\n","");
  uVar4 = 0xf;
  if (local_2e0 != &local_2d0) {
    uVar4 = local_2d0;
  }
  if (uVar4 < (ulong)(local_298 + local_2d8)) {
    uVar4 = 0xf;
    if (local_2a0 != local_290) {
      uVar4 = local_290[0];
    }
    if (uVar4 < (ulong)(local_298 + local_2d8)) goto LAB_0010ec53;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_2e0);
  }
  else {
LAB_0010ec53:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_2a0);
  }
  local_2c0 = &local_2b0;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_2b0 = *puVar1;
    uStack_2a8 = *(undefined4 *)(puVar3 + 3);
    uStack_2a4 = *(undefined4 *)((long)puVar3 + 0x1c);
  }
  else {
    local_2b0 = *puVar1;
    local_2c0 = (ulong *)*puVar3;
  }
  local_2b8 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"...........","");
  uVar4 = 0xf;
  if (local_2c0 != &local_2b0) {
    uVar4 = local_2b0;
  }
  if (uVar4 < (ulong)(local_1d8 + local_2b8)) {
    uVar4 = 0xf;
    if (local_1e0 != local_1d0) {
      uVar4 = local_1d0[0];
    }
    if ((ulong)(local_1d8 + local_2b8) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2c0);
      goto LAB_0010ed54;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_1e0);
LAB_0010ed54:
  local_220 = &local_210;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_210 = *plVar2;
    uStack_208 = puVar3[3];
  }
  else {
    local_210 = *plVar2;
    local_220 = (long *)*puVar3;
  }
  local_218 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_220,_S_in);
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200,local_1f0[0] + 1);
  }
  Init(this,(istream *)local_1b0);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

BaseTag::BaseTag() :
  robot_pos_unknown_(false) {
	current_ = this;
	istringstream iss(
		string("mapSize = 5 10\n") + string("#####...##\n")
			+ string("#####...##\n") + string("#####...##\n")
			+ string("...........\n") + string("..........."));
	Init(iss);
}